

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  long *plVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  uint fd_00;
  int *piVar5;
  int local_30ec;
  int _saved_errno;
  int i;
  int op;
  int fd;
  int nfds;
  int count;
  int nevents;
  int have_signals;
  uint64_t base;
  uint64_t sigmask;
  sigset_t sigset;
  uv__io_t *w;
  QUEUE *q;
  int real_timeout;
  uv__epoll_event e;
  uv__epoll_event *pe;
  uv__epoll_event events [1024];
  int timeout_local;
  uv_loop_t *loop_local;
  
  events[0x3ff].data._4_4_ = timeout;
  if (loop->nfds == 0) {
    if (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                    ,200,"void uv__io_poll(uv_loop_t *, int)");
    }
  }
  else {
    while (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      plVar1 = (long *)loop->watcher_queue[0];
      *(long *)plVar1[1] = *plVar1;
      *(long *)(*plVar1 + 8) = plVar1[1];
      *plVar1 = (long)plVar1;
      plVar1[1] = (long)plVar1;
      sigset.__val[0xf] = (unsigned_long)(plVar1 + -3);
      if ((int)plVar1[2] == 0) {
        __assert_fail("w->pevents != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                      ,0xd2,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)plVar1[3] < 0) {
        __assert_fail("w->fd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                      ,0xd3,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)loop->nwatchers <= (int)plVar1[3]) {
        __assert_fail("w->fd < (int) loop->nwatchers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                      ,0xd4,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._4_4_ = (undefined4)plVar1[2];
      _real_timeout = (long)(int)plVar1[3];
      if (*(int *)((long)plVar1 + 0x14) == 0) {
        _saved_errno = 1;
      }
      else {
        _saved_errno = 3;
      }
      iVar4 = uv__epoll_ctl(loop->backend_fd,_saved_errno,(int)plVar1[3],
                            (uv__epoll_event *)((long)&q + 4));
      if (iVar4 != 0) {
        piVar5 = __errno_location();
        if (*piVar5 != 0x11) {
          abort();
        }
        if (_saved_errno != 1) {
          __assert_fail("op == UV__EPOLL_CTL_ADD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                        ,0xe5,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar4 = uv__epoll_ctl(loop->backend_fd,3,*(int *)(sigset.__val[0xf] + 0x30),
                              (uv__epoll_event *)((long)&q + 4));
        if (iVar4 != 0) {
          abort();
        }
      }
      *(undefined4 *)(sigset.__val[0xf] + 0x2c) = *(undefined4 *)(sigset.__val[0xf] + 0x28);
    }
    base = 0;
    if ((loop->flags & 1) != 0) {
      sigemptyset((sigset_t *)&sigmask);
      sigaddset((sigset_t *)&sigmask,0x1b);
      base = 0x4000000;
    }
    if (events[0x3ff].data._4_4_ < -1) {
      __assert_fail("timeout >= -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                    ,0xf6,"void uv__io_poll(uv_loop_t *, int)");
    }
    uVar2 = loop->time;
    fd = 0x30;
    q._0_4_ = events[0x3ff].data._4_4_;
    do {
      while( true ) {
        if (((base != 0) && (uv__io_poll::no_epoll_pwait != 0)) &&
           (iVar4 = pthread_sigmask(0,(__sigset_t *)&sigmask,(__sigset_t *)0x0), iVar4 != 0)) {
          abort();
        }
        if ((uv__io_poll::no_epoll_wait == 0) && ((base == 0 || (uv__io_poll::no_epoll_pwait != 0)))
           ) {
          op = uv__epoll_wait(loop->backend_fd,(uv__epoll_event *)&pe,0x400,events[0x3ff].data._4_4_
                             );
          if ((op == -1) && (piVar5 = __errno_location(), *piVar5 == 0x26)) {
            uv__io_poll::no_epoll_wait = 1;
          }
        }
        else {
          op = uv__epoll_pwait(loop->backend_fd,(uv__epoll_event *)&pe,0x400,
                               events[0x3ff].data._4_4_,base);
          if ((op == -1) && (piVar5 = __errno_location(), *piVar5 == 0x26)) {
            uv__io_poll::no_epoll_pwait = 1;
          }
        }
        if (((base != 0) && (uv__io_poll::no_epoll_pwait != 0)) &&
           (iVar4 = pthread_sigmask(1,(__sigset_t *)&sigmask,(__sigset_t *)0x0), iVar4 != 0)) {
          abort();
        }
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        uv__update_time(loop);
        piVar5 = __errno_location();
        *piVar5 = iVar4;
        if (op == 0) break;
        if (op == -1) {
          piVar5 = __errno_location();
          if (*piVar5 == 0x26) {
            if ((uv__io_poll::no_epoll_wait != 0) && (uv__io_poll::no_epoll_pwait != 0)) {
              __assert_fail("no_epoll_wait == 0 || no_epoll_pwait == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                            ,0x130,"void uv__io_poll(uv_loop_t *, int)");
            }
          }
          else {
            piVar5 = __errno_location();
            if (*piVar5 != 4) {
              abort();
            }
            if (events[0x3ff].data._4_4_ != -1) {
              if (events[0x3ff].data._4_4_ == 0) {
                return;
              }
              goto LAB_0018f5ea;
            }
          }
        }
        else {
          bVar3 = false;
          nfds = 0;
          if (loop->watchers == (uv__io_t **)0x0) {
            __assert_fail("loop->watchers != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                          ,0x144,"void uv__io_poll(uv_loop_t *, int)");
          }
          loop->watchers[loop->nwatchers] = (uv__io_t *)&pe;
          loop->watchers[loop->nwatchers + 1] = (uv__io_t *)(long)op;
          for (local_30ec = 0; local_30ec < op; local_30ec = local_30ec + 1) {
            e.data = (uint64_t)&events[(long)local_30ec + -1].data;
            fd_00 = (uint)*(undefined8 *)((long)&events[(long)local_30ec + -1].data + 4);
            if (fd_00 != 0xffffffff) {
              if ((int)fd_00 < 0) {
                __assert_fail("fd >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                              ,0x14f,"void uv__io_poll(uv_loop_t *, int)");
              }
              if (loop->nwatchers <= fd_00) {
                __assert_fail("(unsigned) fd < loop->nwatchers",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                              ,0x150,"void uv__io_poll(uv_loop_t *, int)");
              }
              sigset.__val[0xf] = (unsigned_long)loop->watchers[(int)fd_00];
              if ((uv__io_s *)sigset.__val[0xf] == (uv__io_s *)0x0) {
                uv__epoll_ctl(loop->backend_fd,2,fd_00,(uv__epoll_event *)e.data);
              }
              else {
                *(uint *)e.data =
                     (((uv__io_s *)sigset.__val[0xf])->pevents | 0x18) & (uint)*(uint64_t *)e.data;
                if (((int)*(uint64_t *)e.data == 8) || ((int)*(uint64_t *)e.data == 0x10)) {
                  *(uint *)e.data =
                       ((uv__io_s *)sigset.__val[0xf])->pevents & 5 | (uint)*(uint64_t *)e.data;
                }
                if ((int)*(uint64_t *)e.data != 0) {
                  if ((uv__io_t *)sigset.__val[0xf] == &loop->signal_io_watcher) {
                    bVar3 = true;
                  }
                  else {
                    (*((uv__io_s *)sigset.__val[0xf])->cb)
                              (loop,(uv__io_s *)sigset.__val[0xf],(uint)*(uint64_t *)e.data);
                  }
                  nfds = nfds + 1;
                }
              }
            }
          }
          if (bVar3) {
            (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
          }
          loop->watchers[loop->nwatchers] = (uv__io_t *)0x0;
          loop->watchers[loop->nwatchers + 1] = (uv__io_t *)0x0;
          if (bVar3) {
            return;
          }
          if (nfds == 0) {
            if (events[0x3ff].data._4_4_ == 0) {
              return;
            }
            if (events[0x3ff].data._4_4_ != -1) goto LAB_0018f5ea;
          }
          else {
            if (op != 0x400) {
              return;
            }
            fd = fd + -1;
            if (fd == 0) {
              return;
            }
            events[0x3ff].data._4_4_ = 0;
          }
        }
      }
      if (events[0x3ff].data._4_4_ == -1) {
        __assert_fail("timeout != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                      ,0x122,"void uv__io_poll(uv_loop_t *, int)");
      }
      if (events[0x3ff].data._4_4_ == 0) {
        return;
      }
LAB_0018f5ea:
      if (events[0x3ff].data._4_4_ < 1) {
        __assert_fail("timeout > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/linux-core.c"
                      ,0x19d,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._0_4_ = (int)q - ((int)loop->time - (int)uVar2);
      events[0x3ff].data._4_4_ = (int)q;
    } while (0 < (int)q);
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  static int no_epoll_pwait;
  static int no_epoll_wait;
  struct epoll_event events[1024];
  struct epoll_event* pe;
  struct epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  uint64_t sigmask;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  memset(&e, 0, sizeof(e));

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data.fd = w->fd;

    if (w->events == 0)
      op = EPOLL_CTL_ADD;
    else
      op = EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (epoll_ctl(loop->backend_fd, EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  sigmask = 0;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask |= 1 << (SIGPROF - 1);
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  for (;;) {
    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_BLOCK, &sigset, NULL))
        abort();

    if (no_epoll_wait != 0 || (sigmask != 0 && no_epoll_pwait == 0)) {
#if defined(__ANDROID_API__) && __ANDROID_API__ < 21
      nfds = -1;
      errno = ENOSYS;
#else
      nfds = epoll_pwait(loop->backend_fd,
                         events,
                         ARRAY_SIZE(events),
                         timeout,
                         &sigset);
#endif
      if (nfds == -1 && errno == ENOSYS)
        no_epoll_pwait = 1;
    } else {
      nfds = epoll_wait(loop->backend_fd,
                        events,
                        ARRAY_SIZE(events),
                        timeout);
      if (nfds == -1 && errno == ENOSYS)
        no_epoll_wait = 1;
    }

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_UNBLOCK, &sigset, NULL))
        abort();

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno == ENOSYS) {
        /* epoll_wait() or epoll_pwait() failed, try the other system call. */
        assert(no_epoll_wait == 0 || no_epoll_pwait == 0);
        continue;
      }

      if (errno != EINTR)
        abort();

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    {
      /* Squelch a -Waddress-of-packed-member warning with gcc >= 9. */
      union {
        struct epoll_event* events;
        uv__io_t* watchers;
      } x;

      x.events = events;
      assert(loop->watchers != NULL);
      loop->watchers[loop->nwatchers] = x.watchers;
      loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    }

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher)
          have_signals = 1;
        else
          w->cb(loop, w, pe->events);

        nevents++;
      }
    }

    if (have_signals != 0)
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}